

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void FunctionalTester<unsigned_long_long,_void>::Test(void)

{
  char local_98 [8];
  char buf2 [64];
  char buf1 [64];
  TestWatcher<unsigned_long_long> tw;
  
  TestWatcher<unsigned_long_long>::TestWatcher((TestWatcher<unsigned_long_long> *)(buf1 + 0x3f));
  int2str::convert_with_zero<unsigned_long_long,char*>(0,buf2 + 0x38);
  sprintf(local_98,"%llu",0);
  StrcmpAndExit(buf2 + 0x38,local_98);
  int2str::convert_with_zero<unsigned_long_long,char*>(0xffffffffffffffff,buf2 + 0x38);
  sprintf(local_98,"%llu",0xffffffffffffffff);
  StrcmpAndExit(buf2 + 0x38,local_98);
  TestWatcher<unsigned_long_long>::~TestWatcher((TestWatcher<unsigned_long_long> *)(buf1 + 0x3f));
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        char buf1[64];
        char buf2[64];
        int2str::convert_with_zero(std::numeric_limits<T>::min(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::min());
        StrcmpAndExit(buf1, buf2);
        int2str::convert_with_zero(std::numeric_limits<T>::max(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::max());
        StrcmpAndExit(buf1, buf2);
    }